

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O0

Sbd_Srv_t *
Sbd_ManCutServerStart
          (Gia_Man_t *pGia,Vec_Int_t *vMirrors,Vec_Int_t *vLutLevs,Vec_Int_t *vLevs,Vec_Int_t *vRefs
          ,int nLutSize,int nCutSize,int nCutNum,int fVerbose)

{
  Sbd_Srv_t *pSVar1;
  abctime aVar2;
  Vec_Int_t *pVVar3;
  Sbd_Srv_t *p;
  int nLutSize_local;
  Vec_Int_t *vRefs_local;
  Vec_Int_t *vLevs_local;
  Vec_Int_t *vLutLevs_local;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *pGia_local;
  
  if (nCutSize < nLutSize) {
    __assert_fail("nLutSize <= nCutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                  ,0x59,
                  "Sbd_Srv_t *Sbd_ManCutServerStart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                 );
  }
  if (0xe < nCutSize) {
    __assert_fail("nCutSize < SBD_CUT_NO_LEAF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                  ,0x5a,
                  "Sbd_Srv_t *Sbd_ManCutServerStart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                 );
  }
  if ((nCutSize < 2) || (10 < nCutSize)) {
    __assert_fail("nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                  ,0x5b,
                  "Sbd_Srv_t *Sbd_ManCutServerStart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                 );
  }
  if ((1 < nCutNum) && (nCutNum < 0x1f5)) {
    pSVar1 = (Sbd_Srv_t *)calloc(1,0x8d48);
    aVar2 = Abc_Clock();
    pSVar1->clkStart = aVar2;
    pSVar1->nLutSize = nLutSize;
    pSVar1->nCutSize = nCutSize;
    pSVar1->nCutNum = nCutNum;
    pSVar1->fVerbose = fVerbose;
    pSVar1->pGia = pGia;
    pSVar1->vMirrors = vMirrors;
    pSVar1->vLutLevs = vLutLevs;
    pSVar1->vLevs = vLevs;
    pSVar1->vRefs = vRefs;
    pVVar3 = Vec_IntAlloc(100);
    pSVar1->vCut0 = pVVar3;
    pVVar3 = Vec_IntAlloc(100);
    pSVar1->vCut = pVVar3;
    pVVar3 = Vec_IntAlloc(100);
    pSVar1->vCutTop = pVVar3;
    pVVar3 = Vec_IntAlloc(100);
    pSVar1->vCutBot = pVVar3;
    return pSVar1;
  }
  __assert_fail("nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                ,0x5c,
                "Sbd_Srv_t *Sbd_ManCutServerStart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
               );
}

Assistant:

Sbd_Srv_t * Sbd_ManCutServerStart( Gia_Man_t * pGia, Vec_Int_t * vMirrors, 
                                   Vec_Int_t * vLutLevs, Vec_Int_t * vLevs, Vec_Int_t * vRefs, 
                                   int nLutSize, int nCutSize, int nCutNum, int fVerbose )
{
    Sbd_Srv_t * p;
    assert( nLutSize <= nCutSize );
    assert( nCutSize < SBD_CUT_NO_LEAF );
    assert( nCutSize > 1 && nCutSize <= SBD_MAX_CUTSIZE );
    assert( nCutNum > 1 && nCutNum < SBD_MAX_CUTNUM );
    p = ABC_CALLOC( Sbd_Srv_t, 1 );
    p->clkStart = Abc_Clock();
    p->nLutSize = nLutSize;
    p->nCutSize = nCutSize;
    p->nCutNum  = nCutNum;
    p->fVerbose = fVerbose;
    p->pGia     = pGia;
    p->vMirrors = vMirrors;
    p->vLutLevs = vLutLevs;
    p->vLevs    = vLevs;
    p->vRefs    = vRefs;
    p->vCut0    = Vec_IntAlloc( 100 );
    p->vCut     = Vec_IntAlloc( 100 );
    p->vCutTop  = Vec_IntAlloc( 100 );
    p->vCutBot  = Vec_IntAlloc( 100 );
    return p;
}